

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::anon_unknown_0::_is_doc_sep(anon_unknown_0 *this,csubstr s)

{
  code *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  csubstr s_local;
  basic_substring<const_char> local_10;
  
  s_local.len = (size_t)s.str;
  pattern.len = 3;
  pattern.str = "---";
  s_local.str = (char *)this;
  bVar2 = basic_substring<const_char>::begins_with(&s_local,pattern);
  if (bVar2) {
    iVar4 = basic_substring<const_char>::compare(&s_local,"---",3);
    if (iVar4 == 0) {
      return true;
    }
    if (s_local.len < 3) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring(&local_10,s_local.str + 3,s_local.len - 3);
  }
  else {
    pattern_00.len = 3;
    pattern_00.str = "...";
    bVar2 = basic_substring<const_char>::begins_with(&s_local,pattern_00);
    if (!bVar2) {
      return false;
    }
    iVar4 = basic_substring<const_char>::compare(&s_local,"...",3);
    if (iVar4 == 0) {
      return true;
    }
    if (s_local.len < 3) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring(&local_10,s_local.str + 3,s_local.len - 3);
  }
  chars.len = 2;
  chars.str = " \t";
  bVar2 = basic_substring<const_char>::begins_with_any(&local_10,chars);
  return bVar2;
}

Assistant:

bool _is_doc_sep(csubstr s)
{
    constexpr const csubstr dashes = "---";
    constexpr const csubstr ellipsis = "...";
    constexpr const csubstr whitesp = " \t";
    if(s.begins_with(dashes))
        return s == dashes || s.sub(3).begins_with_any(whitesp);
    else if(s.begins_with(ellipsis))
        return s == ellipsis || s.sub(3).begins_with_any(whitesp);
    return false;
}